

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  aiFace *paVar1;
  ostream *this_00;
  uint local_2c;
  uint c;
  aiFace *f;
  uint i;
  uint offset_local;
  aiMesh *m_local;
  PlyExporter *this_local;
  
  for (f._0_4_ = 0; (uint)f < m->mNumFaces; f._0_4_ = (uint)f + 1) {
    paVar1 = m->mFaces + (uint)f;
    std::ostream::operator<<(this,paVar1->mNumIndices);
    for (local_2c = 0; local_2c < paVar1->mNumIndices; local_2c = local_2c + 1) {
      this_00 = std::operator<<((ostream *)this," ");
      std::ostream::operator<<(this_00,paVar1->mIndices[local_2c] + offset);
    }
    std::operator<<((ostream *)this,(string *)&this->endl);
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices;
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << " " << (f.mIndices[c] + offset);
        }
        mOutput << endl;
    }
}